

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

double __thiscall
HighsLpRelaxation::computeBestEstimate(HighsLpRelaxation *this,HighsPseudocost *ps)

{
  bool bVar1;
  pointer pHVar2;
  double *pdVar3;
  const_iterator offset_00;
  const_iterator frac;
  reference offset_01;
  int __x;
  HighsCDouble *in_RDI;
  HighsPseudocost *extraout_XMM0_Qa;
  double dVar4;
  pair<int,_double> *f;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range2;
  double offset;
  HighsCDouble increase;
  HighsCDouble estimate;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  *__lhs;
  double local_78;
  double local_70;
  HighsPseudocost *this_00;
  double dVar5;
  HighsPseudocost *this_01;
  HighsCDouble local_30;
  HighsCDouble local_20 [2];
  
  HighsCDouble::HighsCDouble(local_20,(double)in_RDI[0x536].hi);
  bVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::empty
                    ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     in_RDI);
  if (!bVar1) {
    HighsCDouble::HighsCDouble(&local_30,0.0);
    __x = (int)(((_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                &in_RDI->hi)->_M_impl).super__Vector_impl_data._M_start + 0xe0;
    pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x6055c0);
    __lhs = (__normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             *)pHVar2->feastol;
    std::abs(__x);
    dVar5 = 1.0;
    this_01 = extraout_XMM0_Qa;
    pdVar3 = std::max<double>((double *)&stack0xffffffffffffffc0,(double *)&stack0xffffffffffffffb8)
    ;
    dVar4 = (double)__lhs * *pdVar3;
    pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x605632);
    std::vector<int,_std::allocator<int>_>::size(&pHVar2->integral_cols);
    this_00 = (HighsPseudocost *)(in_RDI + 0x51e);
    offset_00 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                          (in_stack_ffffffffffffff68);
    frac = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                     (in_stack_ffffffffffffff68);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (__lhs,(__normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                                *)in_stack_ffffffffffffff68);
      if (!bVar1) break;
      offset_01 = __gnu_cxx::
                  __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                  ::operator*((__normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                               *)&stack0xffffffffffffffa8);
      local_70 = HighsPseudocost::getPseudocostUp
                           (this_00,(HighsInt)((ulong)offset_00._M_current >> 0x20),
                            (double)frac._M_current,(double)offset_01);
      local_78 = HighsPseudocost::getPseudocostDown
                           (this_01,(HighsInt)((ulong)dVar5 >> 0x20),(double)this_00,
                            (double)offset_00._M_current);
      std::min<double>(&local_70,&local_78);
      HighsCDouble::operator+=(in_RDI,dVar4);
      __gnu_cxx::
      __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
      ::operator++((__normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                    *)&stack0xffffffffffffffa8);
    }
    HighsCDouble::operator_cast_to_double(&local_30);
    HighsCDouble::operator+=(in_RDI,dVar4);
  }
  dVar4 = HighsCDouble::operator_cast_to_double(local_20);
  return dVar4;
}

Assistant:

double HighsLpRelaxation::computeBestEstimate(const HighsPseudocost& ps) const {
  HighsCDouble estimate = objective;

  if (!fractionalints.empty()) {
    // because the pseudocost may be zero, we add an offset to the pseudocost so
    // that we always have some part of the estimate depending on the
    // fractionality.

    HighsCDouble increase = 0.0;
    double offset =
        mipsolver.mipdata_->feastol * std::max(std::abs(objective), 1.0) /
        static_cast<double>(mipsolver.mipdata_->integral_cols.size());

    for (const std::pair<HighsInt, double>& f : fractionalints) {
      increase += std::min(ps.getPseudocostUp(f.first, f.second, offset),
                           ps.getPseudocostDown(f.first, f.second, offset));
    }

    estimate += double(increase);
  }

  return double(estimate);
}